

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O2

bool dxil_spv::is_canonically_normalizing_value(Value *value)

{
  uint uVar1;
  bool bVar2;
  CallInst *pCVar3;
  Value *pVVar4;
  Value *pVVar5;
  uint index;
  uint index_00;
  
  bVar2 = value_is_dx_op_instrinsic(value,Rsqrt);
  if (bVar2) {
    pCVar3 = LLVMBC::cast<LLVMBC::CallInst>(value);
    index = 1;
    pVVar4 = LLVMBC::Instruction::getOperand(&pCVar3->super_Instruction,1);
    bVar2 = value_is_dx_op_instrinsic(pVVar4,Dot2);
    if (bVar2) {
      uVar1 = 2;
    }
    else {
      bVar2 = value_is_dx_op_instrinsic(pVVar4,Dot3);
      if (bVar2) {
        uVar1 = 3;
      }
      else {
        bVar2 = value_is_dx_op_instrinsic(pVVar4,Dot4);
        if (!bVar2) goto LAB_0015aa16;
        uVar1 = 4;
      }
    }
    pCVar3 = LLVMBC::cast<LLVMBC::CallInst>(pVVar4);
    index_00 = uVar1;
    do {
      index_00 = index_00 + 1;
      bVar2 = index - uVar1 == 1;
      if (bVar2) {
        return bVar2;
      }
      pVVar4 = LLVMBC::Instruction::getOperand(&pCVar3->super_Instruction,index);
      pVVar5 = LLVMBC::Instruction::getOperand(&pCVar3->super_Instruction,index_00);
      index = index + 1;
    } while (pVVar4 == pVVar5);
  }
  else {
LAB_0015aa16:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool is_canonically_normalizing_value(const llvm::Value *value)
{
	return value_is_dx_op_instrinsic(value, DXIL::Op::Rsqrt) &&
	       value_is_length_squared(llvm::cast<llvm::CallInst>(value)->getOperand(1));
}